

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O2

void __thiscall tf::NonblockingNotifierV2::commit_wait(NonblockingNotifierV2 *this,Waiter *w)

{
  pointer pWVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  w->state = 0;
  pWVar1 = (this->_waiters).
           super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = w->epoch;
  uVar3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
  do {
    while ((uVar3 & 0x3fff0000000) == 0) {
      (w->next).super___atomic_base<unsigned_long>._M_i = uVar3 & 0xfffffc0000003fff;
      LOCK();
      uVar4 = (this->_state).super___atomic_base<unsigned_long>._M_i;
      bVar5 = uVar3 == uVar4;
      if (bVar5) {
        (this->_state).super___atomic_base<unsigned_long>._M_i =
             (ulong)((uint)uVar3 & 0xfffc000) - 0x4000 | (long)w - (long)pWVar1 >> 7 | uVar2;
        uVar4 = uVar3;
      }
      UNLOCK();
      uVar3 = uVar4;
      if (bVar5) {
        w->epoch = w->epoch + 0x40000000000;
        _park(this,w);
        return;
      }
    }
    LOCK();
    uVar4 = (this->_state).super___atomic_base<unsigned_long>._M_i;
    bVar5 = uVar3 == uVar4;
    if (bVar5) {
      (this->_state).super___atomic_base<unsigned_long>._M_i = uVar3 - 0x10004000;
      uVar4 = uVar3;
    }
    UNLOCK();
    uVar3 = uVar4;
  } while (!bVar5);
  return;
}

Assistant:

void commit_wait(Waiter* w) {
#if __cplusplus >= TF_CPP20
    w->state.store(Waiter::kNotSignaled, std::memory_order_relaxed);
#else
    w->state = Waiter::kNotSignaled;
#endif
    const uint64_t me = (w - &_waiters[0]) | w->epoch;
    uint64_t state = _state.load(std::memory_order_seq_cst);
    for (;;) {
      //_check_state(state, true);
      uint64_t newstate;
      if ((state & kSignalMask) != 0) {
        // Consume the signal and return immediately.
        newstate = state - kWaiterInc - kSignalInc;
      } else {
        // Remove this thread from pre-wait counter and add to the waiter stack.
        newstate = ((state & kWaiterMask) - kWaiterInc) | me;
        w->next.store(state & (kStackMask | kEpochMask), std::memory_order_relaxed);
      }
      //_check_state(newstate);
      if (_state.compare_exchange_weak(state, newstate, std::memory_order_acq_rel)) {
        if ((state & kSignalMask) == 0) {
          w->epoch += kEpochInc;
          _park(w);
        }
        return;
      }
    }
  }